

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirALIGN(void)

{
  uint len_00;
  int local_10;
  aint len;
  aint fill;
  aint val;
  
  ParseAlignArguments(&lp,&len,&local_10);
  if (len == -1) {
    len = 4;
  }
  len_00 = (CurAddress ^ 0xffffffffU) + 1 & len - 1U;
  if (0 < (int)len_00) {
    if (local_10 == -1) {
      EmitBlock(0,len_00,true,4);
    }
    else {
      EmitBlock(local_10,len_00,false,4);
    }
  }
  return;
}

Assistant:

static void dirALIGN() {
	// default alignment is 4, default filler is "0/none" (if not specified in directive explicitly)
	aint val, fill;
	ParseAlignArguments(lp, val, fill);
	if (-1 == val) val = 4;
	// calculate how many bytes has to be filled to reach desired alignment
	aint len = (~CurAddress + 1) & (val - 1);
	if (len < 1) return;		// nothing to fill, already aligned
	if (-1 == fill) EmitBlock(0, len, true);
	else			EmitBlock(fill, len, false);
}